

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReader.cpp
# Opt level: O2

blob_metadata * __thiscall
MILBlob::Blob::StorageReader::Impl::GetMetadata
          (blob_metadata *__return_storage_ptr__,Impl *this,uint64_t offset)

{
  BlobDataType BVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  blob_metadata *pbVar16;
  runtime_error *this_00;
  
  EnsureLoaded(this);
  pbVar16 = MMapFileReader::ReadStruct<MILBlob::Blob::blob_metadata>
                      ((this->m_reader)._M_t.
                       super___uniq_ptr_impl<const_MILBlob::Blob::MMapFileReader,_std::default_delete<const_MILBlob::Blob::MMapFileReader>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_MILBlob::Blob::MMapFileReader_*,_std::default_delete<const_MILBlob::Blob::MMapFileReader>_>
                       .super__Head_base<0UL,_const_MILBlob::Blob::MMapFileReader_*,_false>.
                       _M_head_impl,offset);
  BVar1 = pbVar16->mil_dtype;
  uVar9 = pbVar16->sizeInBytes;
  uVar2 = *(undefined4 *)((long)&pbVar16->sizeInBytes + 4);
  uVar10 = pbVar16->offset;
  uVar3 = *(undefined4 *)((long)&pbVar16->offset + 4);
  uVar11 = pbVar16->reserved_0;
  uVar4 = *(undefined4 *)((long)&pbVar16->reserved_0 + 4);
  uVar12 = pbVar16->reserved_1;
  uVar5 = *(undefined4 *)((long)&pbVar16->reserved_1 + 4);
  uVar13 = pbVar16->reserved_2;
  uVar6 = *(undefined4 *)((long)&pbVar16->reserved_2 + 4);
  uVar14 = pbVar16->reserved_3;
  uVar7 = *(undefined4 *)((long)&pbVar16->reserved_3 + 4);
  uVar15 = pbVar16->reserved_4;
  uVar8 = *(undefined4 *)((long)&pbVar16->reserved_4 + 4);
  __return_storage_ptr__->sentinel = pbVar16->sentinel;
  __return_storage_ptr__->mil_dtype = BVar1;
  *(int *)&__return_storage_ptr__->sizeInBytes = (int)uVar9;
  *(undefined4 *)((long)&__return_storage_ptr__->sizeInBytes + 4) = uVar2;
  *(int *)&__return_storage_ptr__->offset = (int)uVar10;
  *(undefined4 *)((long)&__return_storage_ptr__->offset + 4) = uVar3;
  *(int *)&__return_storage_ptr__->reserved_0 = (int)uVar11;
  *(undefined4 *)((long)&__return_storage_ptr__->reserved_0 + 4) = uVar4;
  *(int *)&__return_storage_ptr__->reserved_1 = (int)uVar12;
  *(undefined4 *)((long)&__return_storage_ptr__->reserved_1 + 4) = uVar5;
  *(int *)&__return_storage_ptr__->reserved_2 = (int)uVar13;
  *(undefined4 *)((long)&__return_storage_ptr__->reserved_2 + 4) = uVar6;
  *(int *)&__return_storage_ptr__->reserved_3 = (int)uVar14;
  *(undefined4 *)((long)&__return_storage_ptr__->reserved_3 + 4) = uVar7;
  *(int *)&__return_storage_ptr__->reserved_4 = (int)uVar15;
  *(undefined4 *)((long)&__return_storage_ptr__->reserved_4 + 4) = uVar8;
  if (__return_storage_ptr__->sentinel == 0xdeadbeef) {
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Invalid sentinel in blob_metadata.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

blob_metadata GetMetadata(uint64_t offset) const
    {
        EnsureLoaded();

        blob_metadata metadata = m_reader->ReadStruct<blob_metadata>(offset);

        // validate sentinel
        MILVerifyIsTrue(metadata.sentinel == BlobMetadataSentinel,
                        std::runtime_error,
                        "Invalid sentinel in blob_metadata.");
        return metadata;
    }